

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int dwarf_get_macro_context
              (Dwarf_Die cu_die,Dwarf_Unsigned *version_out,Dwarf_Macro_Context *macro_context,
              Dwarf_Unsigned *macro_unit_offset_out,Dwarf_Unsigned *macro_ops_count_out,
              Dwarf_Unsigned *macro_ops_data_length,Dwarf_Error *error)

{
  int iVar1;
  
  iVar1 = _dwarf_internal_macro_context
                    (cu_die,0,0,version_out,macro_context,macro_unit_offset_out,macro_ops_count_out,
                     macro_ops_data_length,error);
  return iVar1;
}

Assistant:

int
dwarf_get_macro_context(Dwarf_Die cu_die,
    Dwarf_Unsigned      * version_out,
    Dwarf_Macro_Context * macro_context,
    Dwarf_Unsigned      * macro_unit_offset_out,
    Dwarf_Unsigned      * macro_ops_count_out,
    Dwarf_Unsigned      * macro_ops_data_length,
    Dwarf_Error * error)
{
    int res = 0;
    Dwarf_Bool offset_specified = FALSE;
    Dwarf_Unsigned offset = 0;

    res =  _dwarf_internal_macro_context(cu_die,
        offset_specified,
        offset,
        version_out,
        macro_context,
        macro_unit_offset_out,
        macro_ops_count_out,
        macro_ops_data_length,
        error);
    return res;
}